

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int32_t rle16_find_run(rle16_t *array,int32_t lenarray,uint16_t ikey)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    while( true ) {
      if (lenarray <= (int)uVar2) {
        return ~uVar2;
      }
      uVar1 = uVar2 + (lenarray - 1U) >> 1;
      if (ikey <= (ushort)(array[uVar1].length + array[uVar1].value)) break;
      uVar2 = uVar1 + 1;
    }
    lenarray = uVar1;
  } while (ikey < array[uVar1].value);
  return uVar1;
}

Assistant:

static inline int32_t rle16_find_run(const rle16_t *array, int32_t lenarray,
                                     uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t min = array[middleIndex].value;
        uint16_t max = array[middleIndex].value + array[middleIndex].length;
        if (ikey > max) {
            low = middleIndex + 1;
        } else if (ikey < min) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}